

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_bit_tobit(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  
  if ((*J->base & 0x1f000000) == 0xa000000) {
    recff_bit64_tobit(J,rd);
    return;
  }
  TVar1 = lj_opt_narrow_tobit(J,*J->base);
  *J->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_bit_tobit(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
#if LJ_HASFFI
  if (tref_iscdata(tr)) { recff_bit64_tobit(J, rd); return; }
#endif
  J->base[0] = lj_opt_narrow_tobit(J, tr);
  UNUSED(rd);
}